

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient2dadapt(double *pa,double *pb,double *pc,double detsum)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double t0;
  double s0;
  double t1;
  double s1;
  double u3;
  double u [4];
  int Dlength;
  int C2length;
  int C1length;
  double B3;
  double D [16];
  double C2 [12];
  double C1 [8];
  double B [4];
  double errbound;
  double det;
  double detrighttail;
  double detlefttail;
  double detright;
  double detleft;
  double bcytail;
  double bcxtail;
  double acytail;
  double acxtail;
  double bcy;
  double bcx;
  double acy;
  double acx;
  double detsum_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar2 = *pa - *pc;
  dVar3 = *pb - *pc;
  dVar4 = pa[1] - pc[1];
  dVar5 = pb[1] - pc[1];
  dVar6 = splitter * dVar2 - (splitter * dVar2 - dVar2);
  dVar7 = splitter * dVar5 - (splitter * dVar5 - dVar5);
  dVar6 = (dVar2 - dVar6) * (dVar5 - dVar7) +
          -(-dVar6 * (dVar5 - dVar7) + -(dVar2 - dVar6) * dVar7 + -dVar6 * dVar7 + dVar2 * dVar5);
  dVar7 = splitter * dVar4 - (splitter * dVar4 - dVar4);
  dVar8 = splitter * dVar3 - (splitter * dVar3 - dVar3);
  dVar7 = (dVar4 - dVar7) * (dVar3 - dVar8) +
          -(-dVar7 * (dVar3 - dVar8) + -(dVar4 - dVar7) * dVar8 + -dVar7 * dVar8 + dVar4 * dVar3);
  dVar8 = dVar6 - dVar7;
  dVar9 = dVar6 - dVar8;
  C1[7] = (dVar6 - (dVar8 + dVar9)) + (dVar9 - dVar7);
  pa_local = (double *)estimate(4,C1 + 7);
  if (((double)pa_local < ccwerrboundB * detsum) && (-(double)pa_local < ccwerrboundB * detsum)) {
    dVar6 = (*pa - (dVar2 + (*pa - dVar2))) + ((*pa - dVar2) - *pc);
    dVar7 = (*pb - (dVar3 + (*pb - dVar3))) + ((*pb - dVar3) - *pc);
    dVar8 = (pa[1] - (dVar4 + (pa[1] - dVar4))) + ((pa[1] - dVar4) - pc[1]);
    dVar9 = (pb[1] - (dVar5 + (pb[1] - dVar5))) + ((pb[1] - dVar5) - pc[1]);
    if ((((dVar6 != 0.0) ||
         ((((NAN(dVar6) || (dVar8 != 0.0)) || (NAN(dVar8))) || ((dVar7 != 0.0 || (NAN(dVar7)))))))
        || (dVar9 != 0.0)) || (NAN(dVar9))) {
      dVar10 = ccwerrboundC * detsum + resulterrbound * ABS((double)pa_local);
      pa_local = (double *)
                 (((dVar2 * dVar9 + dVar5 * dVar6) - (dVar4 * dVar7 + dVar3 * dVar8)) +
                 (double)pa_local);
      if (((double)pa_local < dVar10) && (-(double)pa_local < dVar10)) {
        dVar10 = dVar6 * dVar5;
        dVar11 = splitter * dVar6 - (splitter * dVar6 - dVar6);
        dVar12 = splitter * dVar5 - (splitter * dVar5 - dVar5);
        dVar5 = (dVar6 - dVar11) * (dVar5 - dVar12) +
                -(-dVar11 * (dVar5 - dVar12) +
                 -(dVar6 - dVar11) * dVar12 + -dVar11 * dVar12 + dVar10);
        dVar11 = dVar8 * dVar3;
        dVar12 = splitter * dVar8 - (splitter * dVar8 - dVar8);
        dVar13 = splitter * dVar3 - (splitter * dVar3 - dVar3);
        dVar3 = (dVar8 - dVar12) * (dVar3 - dVar13) +
                -(-dVar12 * (dVar3 - dVar13) +
                 -(dVar8 - dVar12) * dVar13 + -dVar12 * dVar13 + dVar11);
        dVar12 = dVar5 - dVar3;
        u3 = (dVar5 - (dVar12 + (dVar5 - dVar12))) + ((dVar5 - dVar12) - dVar3);
        dVar3 = dVar10 + dVar12;
        dVar5 = (dVar10 - (dVar3 - (dVar3 - dVar10))) + (dVar12 - (dVar3 - dVar10));
        dVar10 = dVar5 - dVar11;
        u[0] = (dVar5 - (dVar10 + (dVar5 - dVar10))) + ((dVar5 - dVar10) - dVar11);
        u[2] = dVar3 + dVar10;
        u[1] = (dVar3 - (u[2] - (u[2] - dVar3))) + (dVar10 - (u[2] - dVar3));
        iVar1 = fast_expansion_sum_zeroelim(4,C1 + 7,4,&u3,C2 + 0xb);
        dVar3 = dVar2 * dVar9;
        dVar5 = splitter * dVar2 - (splitter * dVar2 - dVar2);
        dVar10 = splitter * dVar9 - (splitter * dVar9 - dVar9);
        dVar2 = (dVar2 - dVar5) * (dVar9 - dVar10) +
                -(-dVar5 * (dVar9 - dVar10) + -(dVar2 - dVar5) * dVar10 + -dVar5 * dVar10 + dVar3);
        dVar5 = dVar4 * dVar7;
        dVar10 = splitter * dVar4 - (splitter * dVar4 - dVar4);
        dVar11 = splitter * dVar7 - (splitter * dVar7 - dVar7);
        dVar4 = (dVar4 - dVar10) * (dVar7 - dVar11) +
                -(-dVar10 * (dVar7 - dVar11) + -(dVar4 - dVar10) * dVar11 + -dVar10 * dVar11 + dVar5
                 );
        dVar10 = dVar2 - dVar4;
        u3 = (dVar2 - (dVar10 + (dVar2 - dVar10))) + ((dVar2 - dVar10) - dVar4);
        dVar2 = dVar3 + dVar10;
        dVar3 = (dVar3 - (dVar2 - (dVar2 - dVar3))) + (dVar10 - (dVar2 - dVar3));
        dVar4 = dVar3 - dVar5;
        u[0] = (dVar3 - (dVar4 + (dVar3 - dVar4))) + ((dVar3 - dVar4) - dVar5);
        u[2] = dVar2 + dVar4;
        u[1] = (dVar2 - (u[2] - (u[2] - dVar2))) + (dVar4 - (u[2] - dVar2));
        iVar1 = fast_expansion_sum_zeroelim(iVar1,C2 + 0xb,4,&u3,D + 0xf);
        dVar2 = dVar6 * dVar9;
        dVar3 = splitter * dVar6 - (splitter * dVar6 - dVar6);
        dVar4 = splitter * dVar9 - (splitter * dVar9 - dVar9);
        dVar3 = (dVar6 - dVar3) * (dVar9 - dVar4) +
                -(-dVar3 * (dVar9 - dVar4) + -(dVar6 - dVar3) * dVar4 + -dVar3 * dVar4 + dVar2);
        dVar4 = dVar8 * dVar7;
        dVar5 = splitter * dVar8 - (splitter * dVar8 - dVar8);
        dVar6 = splitter * dVar7 - (splitter * dVar7 - dVar7);
        dVar5 = (dVar8 - dVar5) * (dVar7 - dVar6) +
                -(-dVar5 * (dVar7 - dVar6) + -(dVar8 - dVar5) * dVar6 + -dVar5 * dVar6 + dVar4);
        dVar6 = dVar3 - dVar5;
        u3 = (dVar3 - (dVar6 + (dVar3 - dVar6))) + ((dVar3 - dVar6) - dVar5);
        dVar3 = dVar2 + dVar6;
        dVar2 = (dVar2 - (dVar3 - (dVar3 - dVar2))) + (dVar6 - (dVar3 - dVar2));
        dVar5 = dVar2 - dVar4;
        u[0] = (dVar2 - (dVar5 + (dVar2 - dVar5))) + ((dVar2 - dVar5) - dVar4);
        u[2] = dVar3 + dVar5;
        u[1] = (dVar3 - (u[2] - (u[2] - dVar3))) + (dVar5 - (u[2] - dVar3));
        iVar1 = fast_expansion_sum_zeroelim(iVar1,D + 0xf,4,&u3,&B3);
        pa_local = (double *)D[(long)(iVar1 + -1) + -1];
      }
    }
  }
  return (double)pa_local;
}

Assistant:

REAL orient2dadapt(REAL *pa, REAL *pb, REAL *pc, REAL detsum)
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail, bcxtail, bcytail;
  INEXACT REAL detleft, detright;
  REAL detlefttail, detrighttail;
  REAL det, errbound;
  REAL B[4], C1[8], C2[12], D[16];
  INEXACT REAL B3;
  int C1length, C2length, Dlength;
  REAL u[4];
  INEXACT REAL u3;
  INEXACT REAL s1, t1;
  REAL s0, t0;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  acx = (REAL) (pa[0] - pc[0]);
  bcx = (REAL) (pb[0] - pc[0]);
  acy = (REAL) (pa[1] - pc[1]);
  bcy = (REAL) (pb[1] - pc[1]);

  Two_Product(acx, bcy, detleft, detlefttail);
  Two_Product(acy, bcx, detright, detrighttail);

  Two_Two_Diff(detleft, detlefttail, detright, detrighttail,
               B3, B[2], B[1], B[0]);
  B[3] = B3;

  det = estimate(4, B);
  errbound = ccwerrboundB * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pc[0], acx, acxtail);
  Two_Diff_Tail(pb[0], pc[0], bcx, bcxtail);
  Two_Diff_Tail(pa[1], pc[1], acy, acytail);
  Two_Diff_Tail(pb[1], pc[1], bcy, bcytail);

  if ((acxtail == 0.0) && (acytail == 0.0)
      && (bcxtail == 0.0) && (bcytail == 0.0)) {
    return det;
  }

  errbound = ccwerrboundC * detsum + resulterrbound * Absolute(det);
  det += (acx * bcytail + bcy * acxtail)
       - (acy * bcxtail + bcx * acytail);
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Product(acxtail, bcy, s1, s0);
  Two_Product(acytail, bcx, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C1length = fast_expansion_sum_zeroelim(4, B, 4, u, C1);

  Two_Product(acx, bcytail, s1, s0);
  Two_Product(acy, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C2length = fast_expansion_sum_zeroelim(C1length, C1, 4, u, C2);

  Two_Product(acxtail, bcytail, s1, s0);
  Two_Product(acytail, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  Dlength = fast_expansion_sum_zeroelim(C2length, C2, 4, u, D);

  return(D[Dlength - 1]);
}